

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDepthTests.cpp
# Opt level: O2

void __thiscall deqp::gles3::Functional::DepthShader::DepthShader(DepthShader *this)

{
  ShaderProgramDeclaration *pSVar1;
  UniformSlot *pUVar2;
  allocator<char> aStack_238;
  allocator<char> local_237;
  allocator<char> local_236;
  allocator<char> local_235;
  FragmentOutput local_234;
  string local_230 [32];
  FragmentSource local_210;
  string local_1f0 [32];
  VertexSource local_1d0;
  string local_1b0 [32];
  string local_190 [32];
  Uniform local_170;
  VertexAttribute local_148;
  ShaderProgramDeclaration local_120;
  
  sglr::pdec::ShaderProgramDeclaration::ShaderProgramDeclaration(&local_120);
  std::__cxx11::string::string<std::allocator<char>>(local_190,"a_position",&local_235);
  std::__cxx11::string::string((string *)&local_148,local_190);
  local_148.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(&local_120,&local_148);
  local_234.type = GENERICVECTYPE_FLOAT;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_234);
  std::__cxx11::string::string<std::allocator<char>>(local_1b0,"u_color",&local_236);
  std::__cxx11::string::string((string *)&local_170,local_1b0);
  local_170.type = TYPE_FLOAT_VEC4;
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_170);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f0,
             "#version 300 es\nin highp vec4 a_position;\nvoid main (void)\n{\n\tgl_Position = a_position;\n}\n"
             ,&local_237);
  std::__cxx11::string::string((string *)&local_1d0,local_1f0);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_1d0);
  std::__cxx11::string::string<std::allocator<char>>
            (local_230,
             "#version 300 es\nuniform highp vec4 u_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main (void)\n{\n\to_color = u_color;\n}\n"
             ,&aStack_238);
  std::__cxx11::string::string((string *)&local_210,local_230);
  pSVar1 = sglr::pdec::ShaderProgramDeclaration::operator<<(pSVar1,&local_210);
  sglr::ShaderProgram::ShaderProgram(&this->super_ShaderProgram,pSVar1);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string((string *)&local_170);
  std::__cxx11::string::~string(local_1b0);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string(local_190);
  sglr::pdec::ShaderProgramDeclaration::~ShaderProgramDeclaration(&local_120);
  (this->super_ShaderProgram).super_VertexShader._vptr_VertexShader =
       (_func_int **)&PTR_shadeVertices_01e43830;
  (this->super_ShaderProgram).super_GeometryShader._vptr_GeometryShader =
       (_func_int **)&DAT_01e43868;
  (this->super_ShaderProgram).super_FragmentShader._vptr_FragmentShader =
       (_func_int **)&DAT_01e43880;
  pUVar2 = sglr::ShaderProgram::getUniformByName(&this->super_ShaderProgram,"u_color");
  this->u_color = pUVar2;
  return;
}

Assistant:

DepthShader::DepthShader (void)
	: sglr::ShaderProgram(sglr::pdec::ShaderProgramDeclaration()
							<< sglr::pdec::VertexAttribute("a_position", rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::FragmentOutput(rr::GENERICVECTYPE_FLOAT)
							<< sglr::pdec::Uniform("u_color", glu::TYPE_FLOAT_VEC4)
							<< sglr::pdec::VertexSource("#version 300 es\n"
														"in highp vec4 a_position;\n"
														"void main (void)\n"
														"{\n"
														"	gl_Position = a_position;\n"
														"}\n")
							<< sglr::pdec::FragmentSource("#version 300 es\n"
														  "uniform highp vec4 u_color;\n"
														  "layout(location = 0) out mediump vec4 o_color;\n"
														  "void main (void)\n"
														  "{\n"
														  "	o_color = u_color;\n"
														  "}\n"))
	, u_color(getUniformByName("u_color"))
{
}